

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O2

void __thiscall
DataFilters::addNumericFilter
          (DataFilters *this,uint *index,double *minValue,double *maxValue,bool *isAccept)

{
  NumericFilterCase local_20;
  
  local_20.index = *index;
  local_20.filter._maxValue = *maxValue;
  local_20.filter._minValue = *minValue;
  local_20.filter._isAccept = *isAccept;
  std::vector<DataFilters::NumericFilterCase,_std::allocator<DataFilters::NumericFilterCase>_>::
  emplace_back<DataFilters::NumericFilterCase>(&this->_numericFilters,&local_20);
  return;
}

Assistant:

void
    addNumericFilter(unsigned int const & index,
                     double const & minValue,
                     double const & maxValue,
                     bool const & isAccept)
    {
        this->_numericFilters.push_back(NumericFilterCase(index, NumericFilter(minValue, maxValue, isAccept)));
    }